

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::WriteDescriptor
          (WalletBatch *this,uint256 *desc_id,WalletDescriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
  local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_70.first.field_2;
  local_70.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,DBKeys::WALLETDESCRIPTOR_abi_cxx11_,
             DAT_006c42f0 + DBKeys::WALLETDESCRIPTOR_abi_cxx11_);
  local_70.second.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
  local_70.second.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
  local_70.second.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_70.second.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
  bVar2 = WriteIC<std::pair<std::__cxx11::string,uint256>,wallet::WalletDescriptor>
                    (this,&local_70,descriptor,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptor(const uint256& desc_id, const WalletDescriptor& descriptor)
{
    return WriteIC(make_pair(DBKeys::WALLETDESCRIPTOR, desc_id), descriptor);
}